

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

mpt_data_decoder_t mpt_message_decoder(int code)

{
  uint uVar1;
  
  uVar1 = (code & 0x7fU) - 1;
  if (uVar1 < 7) {
    return (mpt_data_decoder_t)(&PTR_mpt_decode_command_00128ad8)[uVar1];
  }
  return (mpt_data_decoder_t)0x0;
}

Assistant:

extern MPT_TYPE(data_decoder) mpt_message_decoder(int code)
{
	switch (code & 0x7f) {
	  /* no encoding */
	  case 0:
	    return 0;
	  /* text message format */
	  case MPT_ENUM(EncodingCommand):
	    return mpt_decode_command;
	  /* normal COBS output */
	  case MPT_ENUM(EncodingCobs):
	    return mpt_decode_cobs;
	  /* COBS with tail inline */
	  case MPT_ENUM(EncodingCobsInline):
	    return mpt_decode_cobs_r;
	  /* compressed COBS output */
	  case MPT_ENUM(EncodingCobs) | MPT_ENUM(EncodingCompress):
	    return mpt_decode_cobs_zpe;
	  /* compressed COBS with tail inline */
	  case MPT_ENUM(EncodingCobsInline) | MPT_ENUM(EncodingCompress):
	    return mpt_decode_cobs_zpe_r;
	  /* invalid encoding */
	  default: return 0;
	}
}